

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displacement_geometry_device.cpp
# Opt level: O1

void device_init(char *cfg)

{
  embree::g_scene = (RTCScene)rtcNewScene(g_device);
  rtcSetSceneFlags(embree::g_scene,4);
  embree::addGroundPlane(embree::g_scene);
  embree::addCube(embree::g_scene);
  rtcCommitScene(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  /* create scene */
  g_scene = rtcNewScene(g_device);
  rtcSetSceneFlags(g_scene,RTC_SCENE_FLAG_ROBUST);

  /* add ground plane */
  addGroundPlane(g_scene);

  /* add cube */
  addCube(g_scene);

  /* commit changes to scene */
  rtcCommitScene (g_scene);
}